

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::SMDImporter::ParseFloat(SMDImporter *this,char *szCurrent,char **szCurrentOut,float *out)

{
  char *pcVar1;
  ulong uVar2;
  
  do {
    uVar2 = (ulong)(byte)*szCurrent;
    if (0x20 < uVar2) {
LAB_0060b715:
      pcVar1 = fast_atoreal_move<float>(szCurrent,out,true);
      *szCurrentOut = pcVar1;
      return true;
    }
    if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
        return false;
      }
      goto LAB_0060b715;
    }
    szCurrent = (char *)((byte *)szCurrent + 1);
  } while( true );
}

Assistant:

bool SMDImporter::ParseFloat(const char* szCurrent, const char** szCurrentOut, float& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    *szCurrentOut = fast_atoreal_move<float>(szCurrent,out);
    return true;
}